

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O3

logic_t slang::SVInt::logicalImpl(SVInt *lhs,SVInt *rhs)

{
  uint8_t uVar1;
  logic_t lVar2;
  logic_t lVar3;
  uint8_t uVar4;
  char cVar5;
  uint8_t uVar6;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint uStack_38;
  undefined1 uStack_34;
  byte bStack_33;
  
  lVar2 = reductionOr(lhs);
  bStack_33 = 0;
  local_40.val._0_6_ = 0;
  local_40.val._6_2_ = 0;
  uStack_34 = 1;
  uStack_38 = 1;
  clearUnusedBits((SVInt *)&local_40);
  lVar3 = operator==(rhs,(SVInt *)&local_40);
  uVar1 = 0x80;
  if (((0x40 < uStack_38) || ((bStack_33 & 1) != 0)) &&
     ((void *)CONCAT26(local_40.val._6_2_,local_40.val._0_6_) != (void *)0x0)) {
    operator_delete__((void *)CONCAT26(local_40.val._6_2_,local_40.val._0_6_));
  }
  cVar5 = lVar2.value == '\0';
  if (lVar2.value == '@') {
    cVar5 = -0x80;
  }
  if (lVar2.value == 0x80) {
    cVar5 = -0x80;
  }
  uVar6 = lVar3.value == '\0';
  if (lVar3.value == '@') {
    uVar6 = uVar1;
  }
  if (lVar3.value == 0x80) {
    uVar6 = uVar1;
  }
  uVar4 = '\0';
  if (uVar6 != '\0' || cVar5 != '\0') {
    uVar4 = uVar1;
  }
  if (uVar6 == '\x01') {
    uVar4 = '\x01';
  }
  if (cVar5 == '\x01') {
    uVar4 = '\x01';
  }
  return (logic_t)uVar4;
}

Assistant:

inline logic_t SVInt::logicalImpl(const SVInt& lhs, const SVInt& rhs) {
    return !lhs || rhs;
}